

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O3

ze_result_t
tracing_layer::zeMemSetAtomicAccessAttributeExp
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,void *ptr,size_t size,
          ze_memory_atomic_attr_exp_flags_t attr)

{
  ulong uVar1;
  _func_void__ze_mem_set_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var2;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_void_ptr_unsigned_long_uint
  *zeApiPtr;
  _ze_result_t _Var3;
  ze_result_t zVar4;
  char *pcVar5;
  ulong *puVar6;
  long lVar7;
  ulong uVar8;
  ze_memory_atomic_attr_exp_flags_t attr_local;
  size_t size_local;
  void *ptr_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  APITracerCallbackDataImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_mem_set_atomic_access_attribute_exp_params_t tracerParams;
  
  if (DAT_00183550 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_void_ptr_unsigned_long_uint
       *)0x0) {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    attr_local = attr;
    size_local = size;
    ptr_local = ptr;
    hDevice_local = hDevice;
    hContext_local = hContext;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar5 = (char *)__tls_get_addr(&PTR_00182fa0);
    if (*pcVar5 != '\0') {
      _Var3 = (*DAT_00183550)(hContext,hDevice,ptr,size,attr);
      return _Var3;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar5 = '\x01';
    tracerParams.phContext = &hContext_local;
    tracerParams.phDevice = &hDevice_local;
    tracerParams.pptr = &ptr_local;
    tracerParams.psize = &size_local;
    tracerParams.pattr = &attr_local;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.apiOrdinal =
         (_func_void__ze_mem_set_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
          *)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar6 != (ulong *)0x0) && (*puVar6 != 0)) {
      lVar7 = 0xcb0;
      uVar8 = 0;
      do {
        uVar1 = puVar6[1];
        prologCallback.current_api_callback =
             *(_func_void__ze_mem_set_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0x758) + lVar7);
        p_Var2 = *(_func_void__ze_mem_set_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x100) + lVar7);
        prologCallback.pUserData = *(void **)(uVar1 + lVar7);
        if (apiCallbackData.prologCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            apiCallbackData.prologCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
                      *)&apiCallbackData.prologCallbacks,
                     (iterator)
                     apiCallbackData.prologCallbacks.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&prologCallback);
        }
        else {
          (apiCallbackData.prologCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               prologCallback.current_api_callback;
          (apiCallbackData.prologCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = prologCallback.pUserData;
          apiCallbackData.prologCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               apiCallbackData.prologCallbacks.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        epilogCallback.pUserData = *(void **)(puVar6[1] + lVar7);
        epilogCallback.current_api_callback = p_Var2;
        if (apiCallbackData.epilogCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            apiCallbackData.epilogCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
                      *)&apiCallbackData.epilogCallbacks,
                     (iterator)
                     apiCallbackData.epilogCallbacks.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&epilogCallback);
        }
        else {
          (apiCallbackData.epilogCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var2;
          (apiCallbackData.epilogCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = epilogCallback.pUserData;
          apiCallbackData.epilogCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               apiCallbackData.epilogCallbacks.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xcb8;
      } while (uVar8 < *puVar6);
    }
    p_Var2 = apiCallbackData.apiOrdinal;
    zeApiPtr = DAT_00183550;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_90,&apiCallbackData.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_a8,&apiCallbackData.epilogCallbacks);
    zVar4 = APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*,void_const*,unsigned_long,unsigned_int),_ze_mem_set_atomic_access_attribute_exp_params_t*,void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_set_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&,void_const*&,unsigned_long&,unsigned_int&>
                      (zeApiPtr,&tracerParams,p_Var2,&local_90,&local_a8,&hContext_local,
                       &hDevice_local,&ptr_local,&size_local,&attr_local);
    if (local_a8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (apiCallbackData.epilogCallbacks.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)apiCallbackData.epilogCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)apiCallbackData.epilogCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (apiCallbackData.prologCallbacks.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(apiCallbackData.prologCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)apiCallbackData.prologCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)apiCallbackData.prologCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_set_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemSetAtomicAccessAttributeExp(
        ze_context_handle_t hContext,                   ///< [in] handle of context
        ze_device_handle_t hDevice,                     ///< [in] device associated with the memory advice
        const void* ptr,                                ///< [in] Pointer to the start of the memory range
        size_t size,                                    ///< [in] Size in bytes of the memory range
        ze_memory_atomic_attr_exp_flags_t attr          ///< [in] Atomic access attributes to set for the specified range.
                                                        ///< Must be 0 (default) or a valid combination of ::ze_memory_atomic_attr_exp_flag_t.
        )
    {
        auto pfnSetAtomicAccessAttributeExp = context.zeDdiTable.MemExp.pfnSetAtomicAccessAttributeExp;

        if( nullptr == pfnSetAtomicAccessAttributeExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.MemExp.pfnSetAtomicAccessAttributeExp, hContext, hDevice, ptr, size, attr);

        // capture parameters
        ze_mem_set_atomic_access_attribute_exp_params_t tracerParams = {
            &hContext,
            &hDevice,
            &ptr,
            &size,
            &attr
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemSetAtomicAccessAttributeExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemSetAtomicAccessAttributeExpCb_t, Mem, pfnSetAtomicAccessAttributeExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.MemExp.pfnSetAtomicAccessAttributeExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.pptr,
                                                  *tracerParams.psize,
                                                  *tracerParams.pattr);
    }